

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelbc.cpp
# Opt level: O3

void __thiscall TPZGeoElBC::TPZGeoElBC(TPZGeoElBC *this,TPZGeoElSide *elside,int matid)

{
  int iVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  
  this->fCreatedElement = (TPZGeoEl *)0x0;
  pTVar3 = elside->fGeoEl;
  iVar1 = elside->fSide;
  iVar2 = (**(code **)(*(long *)pTVar3 + 0x140))(pTVar3,iVar1);
  if (iVar2 != 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelbc.cpp"
               ,0x1c);
  }
  if (iVar1 != -1) {
    pTVar3 = (TPZGeoEl *)(**(code **)(*(long *)pTVar3 + 0x170))(pTVar3,iVar1,matid);
    this->fCreatedElement = pTVar3;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZGeoElBC::TPZGeoElBC(const TPZGeoElSide &, int)",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," - int elside.Side() is -1\n",0x1b);
  return;
}

Assistant:

TPZGeoElBC::TPZGeoElBC(const TPZGeoElSide &elside,int matid):fCreatedElement(NULL){
	TPZGeoEl * el = elside.Element();
	const int side = elside.Side();
	if(el->SideIsUndefined(side)) //Verify if the connectivity was made before the creation of the bc
	{
		DebugStop();
	}
	if (!el || side == -1){
		if (!el) PZError << "Error at " << __PRETTY_FUNCTION__ << " - TPZGeoEl *elside.Element() is NULL\n";
		if (side == -1) PZError << "Error at " << __PRETTY_FUNCTION__ << " - int elside.Side() is -1\n";
		return;
	}
	this->fCreatedElement = el->CreateBCGeoEl( side, matid );
}